

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListDatatypeValidator.cpp
# Opt level: O0

int __thiscall
xercesc_4_0::ListDatatypeValidator::compare
          (ListDatatypeValidator *this,XMLCh *lValue,XMLCh *rValue,MemoryManager *manager)

{
  DatatypeValidator *pDVar1;
  BaseRefVectorOf<char16_t> *toDelete;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  char16_t *pcVar4;
  char16_t *pcVar5;
  ulong uStack_88;
  int returnValue;
  XMLSize_t i;
  XMLSize_t rNumberOfTokens;
  XMLSize_t lNumberOfTokens;
  Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_> janr;
  BaseRefVectorOf<char16_t> *rVector;
  Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_> janl;
  BaseRefVectorOf<char16_t> *lVector;
  DatatypeValidator *theItemTypeDTV;
  MemoryManager *manager_local;
  XMLCh *rValue_local;
  XMLCh *lValue_local;
  ListDatatypeValidator *this_local;
  
  pDVar1 = getItemTypeDTV(this);
  janl.fData = XMLString::tokenizeString(lValue,manager);
  Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_>::Janitor
            ((Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_> *)&rVector,janl.fData);
  toDelete = XMLString::tokenizeString(rValue,manager);
  Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_>::Janitor
            ((Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_> *)&lNumberOfTokens,toDelete);
  XVar2 = BaseRefVectorOf<char16_t>::size(janl.fData);
  XVar3 = BaseRefVectorOf<char16_t>::size(toDelete);
  if (XVar2 < XVar3) {
    this_local._4_4_ = -1;
  }
  else if (XVar3 < XVar2) {
    this_local._4_4_ = 1;
  }
  else {
    for (uStack_88 = 0; uStack_88 < XVar2; uStack_88 = uStack_88 + 1) {
      pcVar4 = BaseRefVectorOf<char16_t>::elementAt(janl.fData,uStack_88);
      pcVar5 = BaseRefVectorOf<char16_t>::elementAt(toDelete,uStack_88);
      this_local._4_4_ =
           (*(pDVar1->super_XSerializable)._vptr_XSerializable[10])(pDVar1,pcVar4,pcVar5,manager);
      if (this_local._4_4_ != 0) goto LAB_003e77d4;
    }
    this_local._4_4_ = 0;
  }
LAB_003e77d4:
  Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_>::~Janitor
            ((Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_> *)&lNumberOfTokens);
  Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_>::~Janitor
            ((Janitor<xercesc_4_0::BaseRefVectorOf<char16_t>_> *)&rVector);
  return this_local._4_4_;
}

Assistant:

int ListDatatypeValidator::compare(const XMLCh*     const lValue
                                 , const XMLCh*     const rValue
                                 , MemoryManager*   const manager)
{
    DatatypeValidator* theItemTypeDTV = getItemTypeDTV();
    BaseRefVectorOf<XMLCh>* lVector = XMLString::tokenizeString(lValue, manager);
    Janitor<BaseRefVectorOf<XMLCh> > janl(lVector);
    BaseRefVectorOf<XMLCh>* rVector = XMLString::tokenizeString(rValue, manager);
    Janitor<BaseRefVectorOf<XMLCh> > janr(rVector);

    XMLSize_t lNumberOfTokens = lVector->size();
    XMLSize_t rNumberOfTokens = rVector->size();

    if (lNumberOfTokens < rNumberOfTokens)
        return -1;
    else if (lNumberOfTokens > rNumberOfTokens)
        return 1;
    else
    { //compare each token
        for ( XMLSize_t i = 0; i < lNumberOfTokens; i++)
        {
            int returnValue = theItemTypeDTV->compare(lVector->elementAt(i), rVector->elementAt(i), manager);
            if (returnValue != 0)
                return returnValue; //REVISIT: does it make sense to return -1 or +1..?
        }
        return 0;
    }

}